

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_add_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  void *__src;
  void *__s;
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  sexp psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  sexp local_58;
  size_t local_50;
  sexp local_48;
  sexp_gc_var_t local_40;
  
  __src = (void *)((long)&a->value + 0x10);
  uVar6 = (a->value).string.offset;
  do {
    uVar7 = uVar6;
    if (uVar7 == 1) break;
    uVar6 = uVar7 - 1;
  } while (*(long *)((long)&a->value + uVar7 * 8 + 8) == 0);
  uVar6 = (b->value).string.offset;
  do {
    uVar3 = uVar6;
    if (uVar3 == 1) break;
    uVar6 = uVar3 - 1;
  } while (*(long *)((long)&b->value + uVar3 * 8 + 8) == 0);
  local_58 = (sexp)0x43e;
  if (uVar7 < uVar3) {
    psVar4 = sexp_bignum_add_digits(ctx,dst,b,a);
    return psVar4;
  }
  local_40.var = &local_58;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  if (dst != (sexp)0x0) {
    uVar6 = (dst->value).string.offset;
    do {
      uVar10 = uVar6;
      if (uVar10 == 1) break;
      uVar6 = uVar10 - 1;
    } while (*(long *)((long)&dst->value + uVar10 * 8 + 8) == 0);
    if (uVar7 <= uVar10) goto LAB_00119c42;
  }
  uVar6 = (a->value).string.offset;
  local_50 = uVar6 * 8;
  local_48 = ctx;
  dst = sexp_alloc_tagged_aux(ctx,uVar6 * 8 + 0x18,0xc);
  (dst->value).string.offset = uVar6;
  uVar10 = (a->value).string.offset;
  if (uVar10 < uVar6) {
    uVar6 = uVar10;
  }
  (dst->value).flonum_bits[0] = (a->value).flonum_bits[0];
  __s = (void *)((long)&dst->value + 0x10);
  memset(__s,0,local_50);
  memmove(__s,__src,uVar6 << 3);
  ctx = local_48;
LAB_00119c42:
  if (uVar3 != 0) {
    uVar10 = 0;
    uVar6 = 0;
    do {
      uVar5 = uVar6;
      uVar2 = *(ulong *)((long)__src + uVar5 * 8);
      uVar8 = *(long *)((long)&b->value + uVar5 * 8 + 0x10) + uVar2;
      *(ulong *)((long)&dst->value + uVar5 * 8 + 0x10) = uVar8 + uVar10;
      uVar9 = ~*(ulong *)((long)&b->value + uVar5 * 8 + 0x10);
      uVar11 = ~uVar10;
      uVar10 = (ulong)(uVar9 < uVar2) + (ulong)(uVar11 < uVar8);
      uVar6 = uVar5 + 1;
    } while (uVar6 < uVar3);
    bVar13 = uVar9 < uVar2 || uVar11 < uVar8;
    if (uVar6 < uVar7 && (uVar9 < uVar2 || uVar11 < uVar8)) {
      uVar6 = uVar5 + 2;
      do {
        plVar1 = (long *)((long)&dst->value + uVar6 * 8 + 8);
        *plVar1 = *plVar1 + 1;
        bVar13 = *plVar1 == 0;
        if (!bVar13) break;
        bVar12 = uVar6 < uVar7;
        uVar6 = uVar6 + 1;
      } while (bVar12);
    }
    if (bVar13) {
      local_58 = dst;
      dst = sexp_copy_bignum(ctx,(sexp)0x0,dst,uVar7 + 1);
      *(undefined8 *)((long)&dst->value + uVar7 * 8 + 0x10) = 1;
    }
  }
  (ctx->value).context.saves = local_40.next;
  return dst;
}

Assistant:

sexp sexp_bignum_add_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    carry=0, i, old_a, p_sum, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if (alen < blen) return sexp_bignum_add_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    old_a = adata[i]; /* adata may alias cdata */
    p_sum = adata[i] + bdata[i];
    cdata[i] = p_sum + carry;
    carry = (old_a > (SEXP_UINT_T_MAX - bdata[i]) ? 1 : 0)
          + (p_sum > (SEXP_UINT_T_MAX - carry) ? 1 : 0);
  }
  for ( ; carry && (i<alen); i++) {
    carry = (cdata[i] == SEXP_UINT_T_MAX ? 1 : 0);
    cdata[i]++;
  }
  if (carry) {
    c = sexp_copy_bignum(ctx, NULL, c, alen+1);
    sexp_bignum_data(c)[alen] = 1;
  }
  sexp_gc_release1(ctx);
  return c;
}